

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

Expression * __thiscall wasm::BranchUtils::BranchTargets::getTarget(BranchTargets *this,Name name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator iter;
  BranchTargets *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  iter._M_node = (_Base_ptr)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Expression_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
       ::find(&(this->inner).targets,(key_type *)&this_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Expression_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
       ::end(&(this->inner).targets);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    __assert_fail("iter != inner.targets.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/branch-utils.h"
                  ,0x1b2,"Expression *wasm::BranchUtils::BranchTargets::getTarget(Name) const");
  }
  ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_wasm::Name,_wasm::Expression_*>_>::
           operator->(&local_28);
  return ppVar2->second;
}

Assistant:

Expression* getTarget(Name name) const {
    auto iter = inner.targets.find(name);
    assert(iter != inner.targets.end());
    return iter->second;
  }